

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementI
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot baseRegSlot,RegSlot indexRegSlot,
          RegSlot regSlot,ProfileId profileId)

{
  code *pcVar1;
  anon_union_8_4_88fdcd80_for_u aVar2;
  StElemInfo *pSVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JITTimeProfileInfo *pJVar7;
  RegOpnd *pRVar8;
  RegOpnd *indexReg;
  JitArenaAllocator *pJVar9;
  Func *pFVar10;
  JitProfilingInstr *pJVar11;
  ProfiledInstr *pPVar12;
  TrackAllocData local_d0;
  anon_union_8_4_88fdcd80_for_u local_a8;
  StElemInfo *newStElemInfo;
  undefined8 local_98;
  TrackAllocData local_90;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_68;
  LdElemInfo *newLdElemInfo;
  IndirOpnd *local_58;
  IndirOpnd *indirOpnd;
  RegOpnd *regOpnd;
  Instr *instr;
  bool isLdElemOrStElemThatWasNotProfiled;
  bool isProfiledInstr;
  bool isProfiledStore;
  anon_union_8_4_88fdcd80_for_u aStack_38;
  bool isProfiledLoad;
  StElemInfo *stElemInfo;
  LdElemInfo *ldElemInfo;
  RegSlot RStack_20;
  ValueType arrayType;
  RegSlot regSlot_local;
  RegSlot indexRegSlot_local;
  RegSlot baseRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  ldElemInfo._4_4_ = regSlot;
  RStack_20 = indexRegSlot;
  bVar4 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x161e,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ValueType::ValueType((ValueType *)((long)&ldElemInfo + 2));
  stElemInfo = (StElemInfo *)0x0;
  aStack_38.ldElemInfo = (LdElemInfo *)0x0;
  instr._7_1_ = 0;
  instr._6_1_ = 0;
  instr._5_1_ = profileId != 0xffff;
  instr._4_1_ = 0;
  if ((bool)instr._5_1_) {
    if (newOpcode == LdElemI_A) {
      bVar4 = DoLoadInstructionArrayProfileInfo(this);
      if (bVar4) {
        pJVar7 = Func::GetReadOnlyProfileInfo(this->m_func);
        stElemInfo = (StElemInfo *)JITTimeProfileInfo::GetLdElemInfo(pJVar7,profileId);
        instr._2_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                      Js::LdElemInfo::GetArrayType((LdElemInfo *)stElemInfo);
        ldElemInfo._2_2_ = instr._2_2_;
        bVar4 = Js::LdElemInfo::WasProfiled((LdElemInfo *)stElemInfo);
        instr._4_1_ = (bVar4 ^ 0xffU) & 1;
        instr._7_1_ = 1;
      }
    }
    else if (((newOpcode == StElemI_A) || (newOpcode == StElemI_A_Strict)) &&
            (bVar4 = DoLoadInstructionArrayProfileInfo(this), bVar4)) {
      instr._6_1_ = 1;
      pJVar7 = Func::GetReadOnlyProfileInfo(this->m_func);
      aStack_38.stElemInfo = JITTimeProfileInfo::GetStElemInfo(pJVar7,profileId);
      instr._0_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                    Js::StElemInfo::GetArrayType(aStack_38.stElemInfo);
      ldElemInfo._2_2_ = instr._0_2_;
      bVar4 = Js::StElemInfo::WasProfiled(aStack_38.stElemInfo);
      instr._4_1_ = (bVar4 ^ 0xffU) & 1;
    }
  }
  pRVar8 = BuildSrcOpnd(this,baseRegSlot,TyVar);
  indexReg = BuildSrcOpnd(this,RStack_20,TyVar);
  local_58 = BuildIndirOpnd(this,pRVar8,indexReg);
  if (((instr._7_1_ & 1) != 0) || ((instr._6_1_ & 1) != 0)) {
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)((long)&ldElemInfo + 2));
    if ((bVar4) && (bVar4 = AllowNativeArrayProfileInfo(this), !bVar4)) {
      newLdElemInfo._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)((long)&ldElemInfo + 2),TypeIds_Array);
      ldElemInfo._2_2_ = newLdElemInfo._6_2_;
      if ((instr._7_1_ & 1) == 0) {
        pJVar9 = this->m_func->m_alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_d0,(type_info *)&Js::StElemInfo::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                   ,0x165b);
        pJVar9 = (JitArenaAllocator *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pJVar9,&local_d0);
        local_a8.ldElemInfo = (LdElemInfo *)new<Memory::JitArenaAllocator>(4,pJVar9,0x4e98c0);
        *local_a8.stElemInfo = *aStack_38.stElemInfo;
        ((local_a8.ldElemInfo)->arrayType).field_0.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ldElemInfo._2_2_;
        aStack_38.ldElemInfo = local_a8.ldElemInfo;
      }
      else {
        pJVar9 = this->m_func->m_alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_90,(type_info *)&Js::LdElemInfo::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                   ,0x1655);
        pJVar9 = (JitArenaAllocator *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pJVar9,&local_90);
        newStElemInfo = (StElemInfo *)Memory::JitArenaAllocator::Alloc;
        local_98 = 0;
        local_68 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                   new<Memory::JitArenaAllocator>(6,pJVar9,0x4e98c0);
        *(StElemInfo *)local_68 = *stElemInfo;
        local_68[2] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(stElemInfo + 1);
        local_68->field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ldElemInfo._2_2_;
        stElemInfo = (StElemInfo *)local_68;
      }
    }
    pRVar8 = IR::IndirOpnd::GetBaseOpnd(local_58);
    IR::Opnd::SetValueType(&pRVar8->super_Opnd,(ValueType)ldElemInfo._2_2_);
    pFVar10 = Func::GetTopFunc(this->m_func);
    BVar5 = Func::HasTry(pFVar10);
    if (BVar5 != 0) {
      pFVar10 = Func::GetTopFunc(this->m_func);
      bVar4 = Func::DoOptimizeTry(pFVar10);
      if (!bVar4) {
        instr._7_1_ = 0;
        instr._6_1_ = 0;
      }
    }
  }
  if (((newOpcode != TypeofElem) && (newOpcode != LdElemI_A)) && (newOpcode != LdMethodElem)) {
    if ((newOpcode == StElemI_A) || (newOpcode == StElemI_A_Strict)) {
      indirOpnd = (IndirOpnd *)BuildSrcOpnd(this,ldElemInfo._4_4_,TyVar);
      bVar4 = Func::DoSimpleJitDynamicProfile(this->m_func);
      if ((bVar4) && ((instr._5_1_ & 1) != 0)) {
        regOpnd = (RegOpnd *)
                  IR::JitProfilingInstr::New
                            (newOpcode,&local_58->super_Opnd,&indirOpnd->super_Opnd,this->m_func);
        pJVar11 = IR::Instr::AsJitProfilingInstr((Instr *)regOpnd);
        pJVar11->profileId = profileId;
      }
      else if ((instr._6_1_ & 1) == 0) {
        regOpnd = (RegOpnd *)
                  IR::Instr::New(newOpcode,&local_58->super_Opnd,&indirOpnd->super_Opnd,this->m_func
                                );
      }
      else {
        regOpnd = (RegOpnd *)
                  IR::ProfiledInstr::New
                            (newOpcode,&local_58->super_Opnd,&indirOpnd->super_Opnd,this->m_func);
        aVar2 = aStack_38;
        pPVar12 = IR::Instr::AsProfiledInstr((Instr *)regOpnd);
        pPVar12->u = aVar2;
      }
      goto LAB_0064d5cf;
    }
    if (1 < (ushort)(newOpcode - DeleteElemI_A)) {
      if (((newOpcode != InitClassMemberComputedName) &&
          (1 < (ushort)(newOpcode - InitClassMemberSetComputedName))) &&
         (2 < (ushort)(newOpcode - InitSetElemI))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x16ad,"(false)","Unknown ElementI opcode");
        if (bVar4) {
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
          return;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      indirOpnd = (IndirOpnd *)BuildSrcOpnd(this,ldElemInfo._4_4_,TyVar);
      regOpnd = (RegOpnd *)
                IR::Instr::New(newOpcode,&local_58->super_Opnd,(Opnd *)indirOpnd,this->m_func);
      goto LAB_0064d5cf;
    }
  }
  indirOpnd = (IndirOpnd *)BuildDstOpnd(this,ldElemInfo._4_4_,TyVar,false,false);
  bVar4 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if ((bVar4) && ((instr._5_1_ & 1) != 0)) {
    regOpnd = (RegOpnd *)
              IR::JitProfilingInstr::New
                        (newOpcode,&indirOpnd->super_Opnd,&local_58->super_Opnd,this->m_func);
    pJVar11 = IR::Instr::AsJitProfilingInstr((Instr *)regOpnd);
    pJVar11->profileId = profileId;
  }
  else if ((instr._7_1_ & 1) == 0) {
    regOpnd = (RegOpnd *)
              IR::Instr::New(newOpcode,&indirOpnd->super_Opnd,&local_58->super_Opnd,this->m_func);
  }
  else {
    regOpnd = (RegOpnd *)
              IR::ProfiledInstr::New
                        (newOpcode,&indirOpnd->super_Opnd,&local_58->super_Opnd,this->m_func);
    pSVar3 = stElemInfo;
    pPVar12 = IR::Instr::AsProfiledInstr((Instr *)regOpnd);
    (pPVar12->u).stElemInfo = pSVar3;
  }
LAB_0064d5cf:
  AddInstr(this,(Instr *)regOpnd,offset);
  if (((instr._4_1_ & 1) != 0) && (bVar4 = DoBailOnNoProfile(this), bVar4)) {
    InsertBailOnNoProfile(this,(Instr *)regOpnd);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementI(Js::OpCode newOpcode, uint32 offset, Js::RegSlot baseRegSlot, Js::RegSlot indexRegSlot,
                        Js::RegSlot regSlot, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    ValueType arrayType;
    const Js::LdElemInfo *ldElemInfo = nullptr;
    const Js::StElemInfo *stElemInfo = nullptr;
    bool isProfiledLoad = false;
    bool isProfiledStore = false;
    bool isProfiledInstr = (profileId != Js::Constants::NoProfileId);
    bool isLdElemOrStElemThatWasNotProfiled = false;

    if (isProfiledInstr)
    {
        switch (newOpcode)
        {
        case Js::OpCode::LdElemI_A:
            if (!DoLoadInstructionArrayProfileInfo())
            {
                break;
            }
            ldElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetLdElemInfo(profileId);
            arrayType = ldElemInfo->GetArrayType();
            isLdElemOrStElemThatWasNotProfiled = !ldElemInfo->WasProfiled();
            isProfiledLoad = true;
            break;

        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
            if (!DoLoadInstructionArrayProfileInfo())
            {
                break;
            }
            isProfiledStore = true;
            stElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetStElemInfo(profileId);
            arrayType = stElemInfo->GetArrayType();
            isLdElemOrStElemThatWasNotProfiled = !stElemInfo->WasProfiled();
            break;
        }
    }

    IR::Instr *     instr;
    IR::RegOpnd *   regOpnd;

    IR::IndirOpnd * indirOpnd;
    indirOpnd = this->BuildIndirOpnd(this->BuildSrcOpnd(baseRegSlot), this->BuildSrcOpnd(indexRegSlot));

    if (isProfiledLoad || isProfiledStore)
    {
        if(arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
        {
            arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);

            // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the
            // ProfiledInstr.
            if(isProfiledLoad)
            {
                Js::LdElemInfo *const newLdElemInfo = JitAnew(m_func->m_alloc, Js::LdElemInfo, *ldElemInfo);
                newLdElemInfo->arrayType = arrayType;
                ldElemInfo = newLdElemInfo;
            }
            else
            {
                Js::StElemInfo *const newStElemInfo = JitAnew(m_func->m_alloc, Js::StElemInfo, *stElemInfo);
                newStElemInfo->arrayType = arrayType;
                stElemInfo = newStElemInfo;
            }
        }
        indirOpnd->GetBaseOpnd()->SetValueType(arrayType);

        if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
        {
            isProfiledLoad = false;
            isProfiledStore = false;
        }
    }

    switch (newOpcode)
    {
    case Js::OpCode::LdMethodElem:
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
    case Js::OpCode::TypeofElem:
        {
            // Evaluate to register

            regOpnd = this->BuildDstOpnd(regSlot);

            if (m_func->DoSimpleJitDynamicProfile() && isProfiledInstr)
            {
                instr = IR::JitProfilingInstr::New(newOpcode, regOpnd, indirOpnd, m_func);
                instr->AsJitProfilingInstr()->profileId = profileId;
            }
            else if (isProfiledLoad)
            {
                instr = IR::ProfiledInstr::New(newOpcode, regOpnd, indirOpnd, m_func);
                instr->AsProfiledInstr()->u.ldElemInfo = ldElemInfo;
            }
            else
            {
                instr = IR::Instr::New(newOpcode, regOpnd, indirOpnd, m_func);
            }
            break;
        }

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        {
            // Store

            regOpnd = this->BuildSrcOpnd(regSlot);

            if (m_func->DoSimpleJitDynamicProfile() && isProfiledInstr)
            {
                instr = IR::JitProfilingInstr::New(newOpcode, indirOpnd, regOpnd, m_func);
                instr->AsJitProfilingInstr()->profileId = profileId;
            }
            else if (isProfiledStore)
            {
                instr = IR::ProfiledInstr::New(newOpcode, indirOpnd, regOpnd, m_func);
                instr->AsProfiledInstr()->u.stElemInfo = stElemInfo;
            }
            else
            {
                instr = IR::Instr::New(newOpcode, indirOpnd, regOpnd, m_func);
            }
            break;
        }

    case Js::OpCode::InitSetElemI:
    case Js::OpCode::InitGetElemI:
    case Js::OpCode::InitComputedProperty:
    case Js::OpCode::InitClassMemberComputedName:
    case Js::OpCode::InitClassMemberGetComputedName:
    case Js::OpCode::InitClassMemberSetComputedName:
        {

            regOpnd = this->BuildSrcOpnd(regSlot);

            instr = IR::Instr::New(newOpcode, indirOpnd, regOpnd, m_func);
            break;
        }

    default:
        AssertMsg(false, "Unknown ElementI opcode");
        return;

    }

    this->AddInstr(instr, offset);

    if(isLdElemOrStElemThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}